

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  ImDrawList *pIVar1;
  ImU32 IVar2;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  float local_3c;
  ImGuiWindow *pIStack_38;
  float border_size;
  ImGuiWindow *window;
  ImGuiContext *g;
  byte local_1d;
  float rounding_local;
  bool border_local;
  ImVec2 IStack_18;
  ImU32 fill_col_local;
  ImVec2 p_max_local;
  ImVec2 p_min_local;
  
  window = (ImGuiWindow *)GImGui;
  pIStack_38 = GImGui->CurrentWindow;
  g._4_4_ = rounding;
  local_1d = border;
  rounding_local = (float)fill_col;
  IStack_18 = p_max;
  p_max_local = p_min;
  ImDrawList::AddRectFilled
            (pIStack_38->DrawList,&p_max_local,&stack0xffffffffffffffe8,fill_col,rounding,0xf);
  local_3c = (float)window[5].LastFrameActive;
  if (((local_1d & 1) != 0) && (0.0 < local_3c)) {
    pIVar1 = pIStack_38->DrawList;
    ImVec2::ImVec2(&local_4c,1.0,1.0);
    local_44 = operator+(&p_max_local,&local_4c);
    ImVec2::ImVec2(&local_5c,1.0,1.0);
    local_54 = operator+(&stack0xffffffffffffffe8,&local_5c);
    IVar2 = GetColorU32(6,1.0);
    ImDrawList::AddRect(pIVar1,&local_44,&local_54,IVar2,g._4_4_,0xf,local_3c);
    pIVar1 = pIStack_38->DrawList;
    IVar2 = GetColorU32(5,1.0);
    ImDrawList::AddRect(pIVar1,&p_max_local,&stack0xffffffffffffffe8,IVar2,g._4_4_,0xf,local_3c);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min+ImVec2(1,1), p_max+ImVec2(1,1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}